

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_func.h
# Opt level: O2

void __thiscall
tvm::runtime::
TypedPackedFunc<tvm::runtime::Module(std::__cxx11::string_const&,std::__cxx11::string_const&)>::
AssignTypedLambda<tvm::runtime::Module(*)(std::__cxx11::string_const&,std::__cxx11::string_const&)>
          (TypedPackedFunc<tvm::runtime::Module(std::__cxx11::string_const&,std::__cxx11::string_const&)>
           *this,_func_Module_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
                 *flambda)

{
  _Any_data local_50;
  code *local_40;
  code *local_38;
  function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)> local_30;
  
  local_50._8_8_ = 0;
  local_38 = std::
             _Function_handler<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/liueo[P]TVM-deploy/tvm/include/tvm/runtime/packed_func.h:1369:24)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/liueo[P]TVM-deploy/tvm/include/tvm/runtime/packed_func.h:1369:24)>
             ::_M_manager;
  local_50._M_unused._0_8_ = (undefined8)flambda;
  std::function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)>::function
            (&local_30,
             (function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)> *)&local_50);
  std::function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)>::operator=
            ((function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)> *)this,&local_30);
  std::_Function_base::~_Function_base(&local_30.super__Function_base);
  std::_Function_base::~_Function_base((_Function_base *)&local_50);
  return;
}

Assistant:

inline void TypedPackedFunc<R(Args...)>::AssignTypedLambda(FType flambda) {
  packed_ = PackedFunc([flambda](const TVMArgs& args, TVMRetValue* rv) {
      detail::unpack_call<R, sizeof...(Args)>(flambda, args, rv);
    });
}